

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

iterator * __thiscall
google::
dense_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
::find<char_const*>(dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *this,char **key)

{
  size_type sVar1;
  dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_RDX;
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_RSI;
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar2;
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *unaff_retaddr;
  pair<unsigned_long,_unsigned_long> pos;
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *key_00;
  
  key_00 = in_RSI;
  sVar1 = dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::size(in_RSI);
  if (sVar1 == 0) {
    dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::end(in_RDI);
  }
  else {
    pVar2 = find_position<char_const*>(unaff_retaddr,(char **)key_00);
    if ((pointer)pVar2.first == (pointer)0xffffffffffffffff) {
      dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
      ::end(in_RDI);
    }
    else {
      dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
      ::dense_hashtable_iterator
                (in_RDX,(dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                         *)pVar2.second,(pointer)pVar2.first,(pointer)in_RSI,
                 SUB81((ulong)in_RDI >> 0x38,0));
    }
  }
  return (iterator *)in_RDI;
}

Assistant:

iterator find(const K& key) {
    if (size() == 0) return end();
    std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first == ILLEGAL_BUCKET)  // alas, not there
      return end();
    else
      return iterator(this, table + pos.first, table + num_buckets, false);
  }